

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int mbedtls_ssl_handshake_server_step(mbedtls_ssl_context *ssl)

{
  int iVar1;
  int iVar2;
  
  iVar2 = -0x7100;
  if (ssl->state == 0x10) {
    return -0x7100;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    return -0x7100;
  }
  iVar1 = mbedtls_ssl_flush_output(ssl);
  if (iVar1 != 0) {
    return iVar1;
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) && (ssl->handshake->retransmit_state == '\x01')) &&
     (iVar1 = mbedtls_ssl_resend(ssl), iVar1 != 0)) {
    return iVar1;
  }
  switch(ssl->state) {
  case 0:
    ssl->state = 1;
    break;
  case 1:
    iVar2 = ssl_parse_client_hello(ssl);
    return iVar2;
  case 2:
    iVar2 = ssl_write_server_hello(ssl);
    return iVar2;
  case 3:
    iVar2 = mbedtls_ssl_write_certificate(ssl);
    return iVar2;
  case 4:
    iVar2 = ssl_write_server_key_exchange(ssl);
    return iVar2;
  case 5:
    iVar2 = ssl_write_certificate_request(ssl);
    return iVar2;
  case 6:
    iVar2 = ssl_write_server_hello_done(ssl);
    return iVar2;
  case 7:
    iVar2 = mbedtls_ssl_parse_certificate(ssl);
    return iVar2;
  case 8:
    iVar2 = ssl_parse_client_key_exchange(ssl);
    return iVar2;
  case 9:
    iVar2 = ssl_parse_certificate_verify(ssl);
    return iVar2;
  case 10:
    iVar2 = mbedtls_ssl_parse_change_cipher_spec(ssl);
    return iVar2;
  case 0xb:
    iVar2 = mbedtls_ssl_parse_finished(ssl);
    return iVar2;
  case 0xc:
    if (ssl->handshake->new_session_ticket == 0) {
      iVar2 = mbedtls_ssl_write_change_cipher_spec(ssl);
      return iVar2;
    }
    iVar2 = ssl_write_new_session_ticket(ssl);
    return iVar2;
  case 0xd:
    iVar2 = mbedtls_ssl_write_finished(ssl);
    return iVar2;
  case 0xe:
    ssl->state = 0xf;
    break;
  case 0xf:
    mbedtls_ssl_handshake_wrapup(ssl);
    break;
  default:
    goto switchD_001197ed_caseD_10;
  case 0x12:
    iVar2 = -0x6a80;
    goto switchD_001197ed_caseD_10;
  }
  iVar2 = 0;
switchD_001197ed_caseD_10:
  return iVar2;
}

Assistant:

int mbedtls_ssl_handshake_server_step( mbedtls_ssl_context *ssl )
{
    int ret = 0;

    if( ssl->state == MBEDTLS_SSL_HANDSHAKE_OVER || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "server state: %d", ssl->state ) );

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
            return( ret );
    }
#endif

    switch( ssl->state )
    {
        case MBEDTLS_SSL_HELLO_REQUEST:
            ssl->state = MBEDTLS_SSL_CLIENT_HELLO;
            break;

        /*
         *  <==   ClientHello
         */
        case MBEDTLS_SSL_CLIENT_HELLO:
            ret = ssl_parse_client_hello( ssl );
            break;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
        case MBEDTLS_SSL_SERVER_HELLO_VERIFY_REQUEST_SENT:
            return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
#endif

        /*
         *  ==>   ServerHello
         *        Certificate
         *      ( ServerKeyExchange  )
         *      ( CertificateRequest )
         *        ServerHelloDone
         */
        case MBEDTLS_SSL_SERVER_HELLO:
            ret = ssl_write_server_hello( ssl );
            break;

        case MBEDTLS_SSL_SERVER_CERTIFICATE:
            ret = mbedtls_ssl_write_certificate( ssl );
            break;

        case MBEDTLS_SSL_SERVER_KEY_EXCHANGE:
            ret = ssl_write_server_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_REQUEST:
            ret = ssl_write_certificate_request( ssl );
            break;

        case MBEDTLS_SSL_SERVER_HELLO_DONE:
            ret = ssl_write_server_hello_done( ssl );
            break;

        /*
         *  <== ( Certificate/Alert  )
         *        ClientKeyExchange
         *      ( CertificateVerify  )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_CLIENT_CERTIFICATE:
            ret = mbedtls_ssl_parse_certificate( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_KEY_EXCHANGE:
            ret = ssl_parse_client_key_exchange( ssl );
            break;

        case MBEDTLS_SSL_CERTIFICATE_VERIFY:
            ret = ssl_parse_certificate_verify( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC:
            ret = mbedtls_ssl_parse_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_CLIENT_FINISHED:
            ret = mbedtls_ssl_parse_finished( ssl );
            break;

        /*
         *  ==> ( NewSessionTicket )
         *        ChangeCipherSpec
         *        Finished
         */
        case MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC:
#if defined(MBEDTLS_SSL_SESSION_TICKETS)
            if( ssl->handshake->new_session_ticket != 0 )
                ret = ssl_write_new_session_ticket( ssl );
            else
#endif
                ret = mbedtls_ssl_write_change_cipher_spec( ssl );
            break;

        case MBEDTLS_SSL_SERVER_FINISHED:
            ret = mbedtls_ssl_write_finished( ssl );
            break;

        case MBEDTLS_SSL_FLUSH_BUFFERS:
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "handshake: done" ) );
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
            break;

        case MBEDTLS_SSL_HANDSHAKE_WRAPUP:
            mbedtls_ssl_handshake_wrapup( ssl );
            break;

        default:
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "invalid state %d", ssl->state ) );
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    return( ret );
}